

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void CServer::ConKick(IResult *pResult,void *pUser)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  char aBuf [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)pResult->m_NumArgs < 2) {
    iVar2 = (*pResult->_vptr_IResult[2])(pResult,0);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      (**(code **)(*pUser + 0xa8))(pUser,iVar2,"Kicked by console",*(code **)(*pUser + 0xa8));
      return;
    }
  }
  else {
    iVar2 = (*pResult->_vptr_IResult[4])(pResult,1);
    str_format(aBuf,0x80,"Kicked (%s)",CONCAT44(extraout_var,iVar2));
    iVar2 = (*pResult->_vptr_IResult[2])(pResult,0);
    (**(code **)(*pUser + 0xa8))(pUser,iVar2,aBuf);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void CServer::ConKick(IConsole::IResult *pResult, void *pUser)
{
	if(pResult->NumArguments() > 1)
	{
		char aBuf[128];
		str_format(aBuf, sizeof(aBuf), "Kicked (%s)", pResult->GetString(1));
		((CServer *)pUser)->Kick(pResult->GetInteger(0), aBuf);
	}
	else
		((CServer *)pUser)->Kick(pResult->GetInteger(0), "Kicked by console");
}